

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_dr_flac *
ma_dr_flac_open_with_metadata_private
          (ma_dr_flac_read_proc onRead,ma_dr_flac_seek_proc onSeek,ma_dr_flac_meta_proc onMeta,
          ma_dr_flac_container container,void *pUserData,void *pUserDataMD,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  char *pcVar1;
  void *__dest;
  ushort *puVar2;
  ulong uVar3;
  ma_dr_flac *pmVar4;
  byte bVar5;
  ma_bool32 mVar6;
  uint uVar7;
  ma_result mVar8;
  ma_uint8 *pNum_1;
  size_t sVar9;
  ma_dr_flac *pmVar10;
  ulong *__src;
  ulong uVar11;
  uint *puVar12;
  uint *puVar13;
  ma_int32 *pmVar14;
  ulong *puVar15;
  ulong *puVar16;
  char cVar17;
  ma_uint8 *pNum;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ma_dr_flac_seekpoint *pmVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  ma_uint64 mVar25;
  ulong uVar26;
  ma_uint32 mVar27;
  ma_uint8 *pNum_2;
  void *pvVar28;
  ulong *puVar29;
  ma_uint8 id [4];
  ma_bool32 in_stack_ffffffffffffecb8;
  _func_void_void_ptr_void_ptr *local_1338;
  _func_void_ptr_void_ptr_size_t_void_ptr *local_1328;
  undefined4 local_131c;
  ma_dr_flac_seek_proc local_1318;
  ulong local_1310;
  _func_void_ptr_size_t_void_ptr *local_1308;
  uint local_1300;
  uint local_12fc;
  void *local_12f8;
  ulong local_12f0;
  ma_dr_flac *local_12e8;
  ulong local_12e0;
  ma_dr_flac_metadata local_12d8;
  ulong local_1228;
  ma_dr_flac_init_info local_1220;
  
  if (ma_dr_flac__init_cpu_caps()::isCPUCapsInitialized == '\0') {
    lVar23 = cpuid(0x80000001);
    ma_dr_flac__gIsLZCNTSupported = *(uint *)(lVar23 + 0xc) >> 5 & 1;
    ma_dr_flac__gIsSSE2Supported = 1;
    ma_dr_flac__init_cpu_caps()::isCPUCapsInitialized = '\x01';
  }
  if (onSeek != (ma_dr_flac_seek_proc)0x0 && onRead != (ma_dr_flac_read_proc)0x0) {
    local_1318 = onSeek;
    local_12f8 = pUserDataMD;
    memset(&local_1220.container,0,0x11d8);
    local_1220.onSeek = local_1318;
    local_1220.pUserDataMD = local_12f8;
    local_1220.bs.onSeek = local_1318;
    local_1220.bs.nextL2Line = 0x200;
    local_1220.bs.consumedBits = 0x40;
    local_1220.bs.unalignedByteCount = 0;
    local_1220.bs.unalignedCache = 0;
    local_1220.onRead = onRead;
    local_1220.onMeta = onMeta;
    local_1220.container = container;
    local_1220.pUserData = pUserData;
    local_1220.bs.onRead = onRead;
    local_1220.bs.pUserData = pUserData;
    sVar9 = (*onRead)(pUserData,&local_131c,4);
    if (sVar9 == 4) {
      do {
        local_1220.runningFilePos = local_1220.runningFilePos + 4;
        if ((((char)local_131c != 'I') || (local_131c._1_1_ != 'D')) || (local_131c._2_1_ != '3')) {
          if (local_131c._3_1_ == 'C' &&
              (local_131c._2_1_ == 'a' && (local_131c._1_1_ == 'L' && (char)local_131c == 'f'))) {
LAB_0015620f:
            mVar6 = ma_dr_flac__init_private__native
                              (&local_1220,onRead,(ma_dr_flac_seek_proc)onMeta,
                               (ma_dr_flac_meta_proc)pUserData,local_12f8,
                               (void *)(ulong)(container != ma_dr_flac_container_unknown),
                               in_stack_ffffffffffffecb8);
          }
          else {
            if (local_131c._3_1_ != 'S' ||
                (local_131c._2_1_ != 'g' || (local_131c._1_1_ != 'g' || (char)local_131c != 'O'))) {
              if (container == ma_dr_flac_container_unknown) {
                return (ma_dr_flac *)0x0;
              }
              if (container != ma_dr_flac_container_ogg) {
                if (container != ma_dr_flac_container_native) {
                  return (ma_dr_flac *)0x0;
                }
                goto LAB_0015620f;
              }
            }
            mVar6 = ma_dr_flac__init_private__ogg
                              (&local_1220,onRead,local_1318,onMeta,pUserData,local_12f8,
                               in_stack_ffffffffffffecb8);
          }
          if (mVar6 == 0) {
            return (ma_dr_flac *)0x0;
          }
          if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
            local_1308 = ma_dr_flac__malloc_default;
            local_1328 = ma_dr_flac__realloc_default;
            local_1338 = ma_dr_flac__free_default;
            pvVar28 = (void *)0x0;
          }
          else {
            local_1338 = pAllocationCallbacks->onFree;
            if (local_1338 == (_func_void_void_ptr_void_ptr *)0x0) {
              return (ma_dr_flac *)0x0;
            }
            local_1328 = pAllocationCallbacks->onRealloc;
            local_1308 = pAllocationCallbacks->onMalloc;
            if (local_1308 == (_func_void_ptr_size_t_void_ptr *)0x0 &&
                local_1328 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
              return (ma_dr_flac *)0x0;
            }
            pvVar28 = pAllocationCallbacks->pUserData;
          }
          uVar24 = (uint)local_1220.channels *
                   (((local_1220.maxBlockSizeInPCMFrames >> 4) + 1) -
                   (uint)((local_1220.maxBlockSizeInPCMFrames & 0xf) == 0)) * 0x40;
          if (local_1220.container == ma_dr_flac_container_ogg) {
            if (local_1308 == (_func_void_ptr_size_t_void_ptr *)0x0) {
              if (local_1328 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
                return (ma_dr_flac *)0x0;
              }
              pmVar10 = (ma_dr_flac *)(*local_1328)((void *)0x0,0x10198,pvVar28);
            }
            else {
              pmVar10 = (ma_dr_flac *)(*local_1308)(0x10198,pvVar28);
            }
            if (pmVar10 == (ma_dr_flac *)0x0) {
              return (ma_dr_flac *)0x0;
            }
            uVar20 = uVar24 + 0x11360;
            memset(&(pmVar10->allocationCallbacks).onFree,0,0x10170);
            pmVar10->onMeta = (ma_dr_flac_meta_proc)onRead;
            pmVar10->pUserDataMD = local_1318;
            (pmVar10->allocationCallbacks).pUserData = pUserData;
            (pmVar10->allocationCallbacks).onMalloc =
                 (_func_void_ptr_size_t_void_ptr *)local_1220.oggFirstBytePos;
            (pmVar10->allocationCallbacks).onRealloc =
                 (_func_void_ptr_void_ptr_size_t_void_ptr *)local_1220.oggFirstBytePos;
            *(ma_uint32 *)&(pmVar10->allocationCallbacks).onFree = local_1220.oggSerial;
            memcpy(&pmVar10->sampleRate,&local_1220.oggBosHeader,0x120);
          }
          else {
            uVar20 = uVar24 + 0x11c8;
            pmVar10 = (ma_dr_flac *)0x0;
          }
          sVar9 = (size_t)uVar20;
          local_12e8 = pmVar10;
          local_12e0 = (ulong)uVar24;
          if (local_1220.hasMetadataBlocks == 0) {
            local_1318 = (ma_dr_flac_seek_proc)0x0;
            mVar25 = 0x2a;
            uVar19 = 0;
            goto LAB_00156c2c;
          }
          if (local_1220.container == ma_dr_flac_container_ogg) {
            local_1318 = ma_dr_flac__on_seek_ogg;
            pUserData = pmVar10;
            onRead = ma_dr_flac__on_read_ogg;
          }
          local_1228 = sVar9;
          sVar9 = (*onRead)(pUserData,&local_131c,4);
          if (sVar9 != 4) goto joined_r0x00156dab;
          local_12f0 = 0;
          mVar25 = 0x2a;
          local_1300 = 0;
          goto LAB_00156445;
        }
        sVar9 = (*onRead)(pUserData,&local_12d8,6);
        if (sVar9 != 6) {
          return (ma_dr_flac *)0x0;
        }
        local_1220.runningFilePos = local_1220.runningFilePos + 6;
        uVar20 = ((((ushort)local_12d8._4_2_ & 0xff) << 0x10) >> 8 & 0x7f00) >> 1;
        uVar24 = uVar20 + 10;
        if ((local_12d8.type._1_1_ & 0x10) == 0) {
          uVar24 = uVar20;
        }
        uVar24 = uVar24 + ((((ushort)local_12d8._4_2_ & 0x7f00) << 0x10) >> 0x18 |
                           ((local_12d8.type._2_2_ & 0x7f00) << 8) >> 2 |
                          ((local_12d8.type._2_2_ & 0x7f) << 0x18) >> 3);
        mVar6 = (*local_1318)(pUserData,uVar24,ma_dr_flac_seek_origin_current);
        if (mVar6 == 0) {
          return (ma_dr_flac *)0x0;
        }
        local_1220.runningFilePos = local_1220.runningFilePos + uVar24;
        sVar9 = (*onRead)(pUserData,&local_131c,4);
      } while (sVar9 == 4);
    }
  }
  return (ma_dr_flac *)0x0;
LAB_00156445:
  uVar24 = local_131c >> 0x18 | (local_131c & 0xff0000) >> 8 | (local_131c & 0xff00) << 8;
  uVar18 = uVar24 | local_131c << 0x18;
  uVar19 = (ulong)uVar24;
  uVar26 = mVar25 + 4;
  uVar20 = local_131c << 0x18 & 0x7f000000;
  uVar7 = uVar20 >> 0x18;
  local_12d8.type._0_1_ = (undefined1)(uVar20 >> 0x18);
  local_12d8.type._1_1_ = 0;
  local_12d8.type._2_2_ = 0;
  local_12d8.pRawData = (ulong *)0x0;
  local_12d8.rawDataSize = 0;
  local_1310 = uVar19;
  switch(uVar7) {
  case 1:
    if (onMeta == (ma_dr_flac_meta_proc)0x0) break;
    local_12d8.data.application.id = 0;
    mVar6 = (*local_1318)(pUserData,uVar24,ma_dr_flac_seek_origin_current);
    if (mVar6 == 0) goto LAB_00156f55;
    (*onMeta)(local_12f8,&local_12d8);
    uVar19 = local_1310;
    goto LAB_00156bef;
  case 2:
    if (uVar24 < 4) goto joined_r0x00156dab;
    if (onMeta != (ma_dr_flac_meta_proc)0x0) {
      if (local_1308 == (_func_void_ptr_size_t_void_ptr *)0x0) {
        if (local_1328 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto joined_r0x00156dab;
        __src = (ulong *)(*local_1328)((void *)0x0,uVar19,pvVar28);
      }
      else {
        __src = (ulong *)(*local_1308)(uVar19,pvVar28);
      }
      if (__src != (ulong *)0x0) {
        sVar9 = (*onRead)(pUserData,__src,uVar19);
        if (sVar9 == uVar19) {
          local_12d8.rawDataSize = (ma_uint32)local_1310;
          uVar24 = (uint)*__src;
          local_12d8.data.application.id =
               uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18;
          local_12d8.data.application.pData = (void *)((long)__src + 4);
          local_12d8.data.application.dataSize = local_12d8.rawDataSize - 4;
LAB_001569bb:
          uVar19 = local_1310;
          local_12d8.pRawData = __src;
          (*onMeta)(local_12f8,&local_12d8);
          (*local_1338)(__src,pvVar28);
          goto LAB_00156bef;
        }
LAB_00156f22:
        (*local_1338)(__src,pvVar28);
      }
      goto joined_r0x00156dab;
    }
    break;
  case 3:
    local_1300 = uVar24;
    local_12f0 = uVar26;
    if (onMeta != (ma_dr_flac_meta_proc)0x0) {
      local_12f0 = uVar19 / 0x12;
      uVar19 = (ulong)((uVar24 / 0x12) * 0x18);
      if (local_1308 == (_func_void_ptr_size_t_void_ptr *)0x0) {
        local_12fc = uVar18;
        if (local_1328 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto joined_r0x00156dab;
        puVar15 = (ulong *)(*local_1328)((void *)0x0,uVar19,pvVar28);
      }
      else {
        local_12fc = uVar18;
        puVar15 = (ulong *)(*local_1308)(uVar19,pvVar28);
      }
      if (puVar15 == (ulong *)0x0) goto joined_r0x00156dab;
      if (0x11 < (uint)local_1310) {
        lVar23 = 0;
        do {
          sVar9 = (*onRead)(pUserData,(void *)((long)puVar15 + lVar23),0x12);
          __src = puVar15;
          if (sVar9 != 0x12) goto LAB_00156f22;
          uVar19 = *(ulong *)((long)puVar15 + lVar23);
          uVar11 = *(ulong *)((long)puVar15 + lVar23 + 8);
          *(ulong *)((long)puVar15 + lVar23) =
               uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
               (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
               (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28
               | uVar19 << 0x38;
          *(ulong *)((long)puVar15 + lVar23 + 8) =
               uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
               (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
               (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28
               | uVar11 << 0x38;
          puVar2 = (ushort *)((long)puVar15 + lVar23 + 0x10);
          *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
          lVar23 = lVar23 + 0x18;
        } while ((ulong)((uVar24 / 0x12) * 8) * 3 != lVar23);
      }
      local_1300 = (uint)local_1310;
      local_12d8.data.application.id = (ma_uint32)local_12f0;
      local_12f0 = uVar26;
      local_12d8.pRawData = puVar15;
      local_12d8.rawDataSize = local_1300;
      local_12d8.data._8_8_ = puVar15;
LAB_00156ba5:
      (*onMeta)(local_12f8,&local_12d8);
      (*local_1338)(puVar15,pvVar28);
      uVar18 = local_12fc;
    }
    break;
  case 4:
    local_12fc = uVar18;
    if (uVar24 < 8) goto joined_r0x00156dab;
    if (onMeta != (ma_dr_flac_meta_proc)0x0) {
      if (local_1308 == (_func_void_ptr_size_t_void_ptr *)0x0) {
        if (local_1328 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto joined_r0x00156dab;
        puVar15 = (ulong *)(*local_1328)((void *)0x0,uVar19,pvVar28);
      }
      else {
        puVar15 = (ulong *)(*local_1308)(uVar19,pvVar28);
      }
      if (puVar15 != (ulong *)0x0) {
        sVar9 = (*onRead)(pUserData,puVar15,uVar19);
        __src = puVar15;
        if (sVar9 == uVar19) {
          local_12d8.rawDataSize = (ma_uint32)local_1310;
          local_12d8.data.application.id = (ma_uint32)*puVar15;
          uVar11 = (ulong)local_12d8.data.application.id;
          local_12d8.pRawData = puVar15;
          if (uVar11 <= uVar19 - 8) {
            local_12d8.data.application.pData = (void *)((long)puVar15 + 4);
            puVar13 = (uint *)((long)puVar15 + uVar11 + 8);
            local_12d8.data.application.dataSize = *(uint *)((long)puVar15 + uVar11 + 4);
            uVar11 = (ulong)local_12d8.data.application.dataSize;
            puVar12 = puVar13;
            uVar24 = local_12d8.data.application.dataSize;
            if (uVar11 <= (long)puVar15 + (uVar19 - (long)puVar13) >> 2) {
              while (local_12d8.data.vorbis_comment.pComments = puVar13, uVar24 != 0) {
                if ((long)((long)puVar15 + (uVar19 - (long)puVar12)) < 4) goto LAB_00156f22;
                if ((long)((long)puVar15 + (uVar19 - (long)(puVar12 + 1))) < (long)(ulong)*puVar12)
                goto LAB_00156f22;
                uVar24 = (int)uVar11 - 1;
                uVar11 = (ulong)uVar24;
                puVar12 = (uint *)((long)(puVar12 + 1) + (ulong)*puVar12);
              }
              goto LAB_00156ba5;
            }
          }
        }
        goto LAB_00156f22;
      }
      goto joined_r0x00156dab;
    }
    break;
  case 5:
    local_12fc = uVar18;
    if (uVar24 < 0x18c) goto joined_r0x00156dab;
    if (onMeta != (ma_dr_flac_meta_proc)0x0) {
      if (local_1308 == (_func_void_ptr_size_t_void_ptr *)0x0) {
        if (local_1328 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto joined_r0x00156dab;
        __src = (ulong *)(*local_1328)((void *)0x0,uVar19,pvVar28);
      }
      else {
        __src = (ulong *)(*local_1308)(uVar19,pvVar28);
      }
      if (__src != (ulong *)0x0) {
        sVar9 = (*onRead)(pUserData,__src,uVar19);
        if (sVar9 == uVar19) {
          local_12d8.rawDataSize = (ma_uint32)local_1310;
          local_12d8.pRawData = __src;
          memcpy(&local_12d8.data,__src,0x80);
          uVar11 = __src[0x10];
          local_12d8.data.cuesheet.leadInSampleCount =
               uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
               (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
               (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28
               | uVar11 << 0x38;
          local_12d8.data.cuesheet.isCD = (ma_bool32)(byte)((byte)__src[0x11] >> 7);
          local_12d8.data.cuesheet.trackCount = *(byte *)((long)__src + 0x18b);
          puVar29 = (ulong *)((long)__src + 0x18c);
          local_12d8.data.cuesheet.pTrackData = (ulong *)0x0;
          sVar9 = (ulong)((uint)local_12d8.data.cuesheet.trackCount * 4) * 9;
          puVar15 = puVar29;
          for (bVar5 = local_12d8.data.cuesheet.trackCount; bVar5 != 0; bVar5 = bVar5 - 1) {
            if ((long)((long)__src + (uVar19 - (long)puVar15)) < 0x24) goto LAB_00156f22;
            uVar11 = (ulong)((uint)*(byte *)((long)puVar15 + 0x23) * 4);
            lVar23 = uVar11 * 3;
            lVar22 = (long)__src + (uVar19 - ((long)puVar15 + 0x24));
            if (SBORROW8(lVar22,lVar23) != (long)(lVar22 + uVar11 * -3) < 0) goto LAB_00156f22;
            sVar9 = sVar9 + (ulong)*(byte *)((long)puVar15 + 0x23) * 0x10;
            puVar15 = (ulong *)((long)((long)puVar15 + 0x24) + lVar23);
          }
          if (local_1308 == (_func_void_ptr_size_t_void_ptr *)0x0) {
            if (local_1328 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto LAB_00156f22;
            puVar15 = (ulong *)(*local_1328)((void *)0x0,sVar9,pvVar28);
          }
          else {
            puVar15 = (ulong *)(*local_1308)(sVar9,pvVar28);
          }
          if (puVar15 != (ulong *)0x0) {
            if (local_12d8.data.cuesheet.trackCount != 0) {
              bVar5 = 0;
              puVar16 = puVar15;
              do {
                *(uint *)(puVar16 + 4) = (uint)puVar29[4];
                uVar19 = *puVar29;
                uVar11 = puVar29[1];
                uVar3 = puVar29[3];
                puVar16[2] = puVar29[2];
                puVar16[3] = uVar3;
                *puVar16 = uVar19;
                puVar16[1] = uVar11;
                pcVar1 = (char *)((long)puVar29 + 0x23);
                puVar29 = (ulong *)((long)puVar29 + 0x24);
                puVar16 = (ulong *)((long)puVar16 + 0x24);
                for (cVar17 = *pcVar1; cVar17 != '\0'; cVar17 = cVar17 + -1) {
                  uVar19 = *puVar29;
                  *puVar16 = uVar19;
                  *(uint *)(puVar16 + 1) = (uint)puVar29[1];
                  puVar29 = (ulong *)((long)puVar29 + 0xc);
                  *puVar16 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                             (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                             (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                             (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
                  puVar16 = puVar16 + 2;
                }
                bVar5 = bVar5 + 1;
              } while (bVar5 < local_12d8.data.cuesheet.trackCount);
            }
            local_12d8.data.cuesheet.pTrackData = puVar15;
            (*local_1338)(__src,pvVar28);
            goto LAB_00156ba5;
          }
        }
        goto LAB_00156f22;
      }
      goto joined_r0x00156dab;
    }
    break;
  case 6:
    if (uVar24 < 0x20) goto joined_r0x00156dab;
    if (onMeta != (ma_dr_flac_meta_proc)0x0) {
      if (local_1308 == (_func_void_ptr_size_t_void_ptr *)0x0) {
        if (local_1328 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto joined_r0x00156dab;
        __src = (ulong *)(*local_1328)((void *)0x0,uVar19,pvVar28);
      }
      else {
        __src = (ulong *)(*local_1308)(uVar19,pvVar28);
      }
      if (__src != (ulong *)0x0) {
        sVar9 = (*onRead)(pUserData,__src,uVar19);
        if (sVar9 == uVar19) {
          local_12d8.rawDataSize = (ma_uint32)local_1310;
          uVar24 = (uint)*__src;
          local_12d8.data.application.id =
               uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18;
          uVar24 = *(uint *)((long)__src + 4);
          local_12d8.data.streaminfo.minFrameSizeInPCMFrames =
               uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18;
          uVar11 = (ulong)local_12d8.data.streaminfo.minFrameSizeInPCMFrames;
          local_12d8.pRawData = __src;
          if (uVar11 <= uVar19 - 0x20) {
            local_12d8.data.application.pData = __src + 1;
            puVar12 = (uint *)((long)__src + uVar11 + 0xc);
            uVar24 = *(uint *)((long)__src + uVar11 + 8);
            local_12d8.data.application.dataSize =
                 uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18
            ;
            if ((long)(ulong)local_12d8.data.application.dataSize <=
                (long)((long)__src + (uVar19 - (long)puVar12) + -0x14)) {
              puVar13 = (uint *)((long)puVar12 + (ulong)local_12d8.data.application.dataSize);
              local_12d8.data.picture.pPictureData = (ma_uint8 *)(puVar13 + 5);
              uVar24 = *puVar13;
              local_12d8.data.picture.width =
                   uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                   uVar24 << 0x18;
              uVar24 = puVar13[1];
              local_12d8.data.picture.height =
                   uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                   uVar24 << 0x18;
              uVar24 = puVar13[2];
              local_12d8.data.picture.colorDepth =
                   uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                   uVar24 << 0x18;
              uVar24 = puVar13[3];
              local_12d8.data.picture.indexColorCount =
                   uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                   uVar24 << 0x18;
              uVar24 = puVar13[4];
              local_12d8.data.picture.pictureDataSize =
                   uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                   uVar24 << 0x18;
              local_12d8.data._24_8_ = puVar12;
              if ((long)(ulong)local_12d8.data.picture.pictureDataSize <=
                  (long)((long)__src + (uVar19 - (long)local_12d8.data.picture.pPictureData))) {
                (*onMeta)(local_12f8,&local_12d8);
                (*local_1338)(__src,pvVar28);
                uVar19 = local_1310;
                goto LAB_00156bef;
              }
            }
          }
        }
        goto LAB_00156f22;
      }
      goto joined_r0x00156dab;
    }
    break;
  default:
    if (uVar7 == 0x7f) {
      if (onMeta == (ma_dr_flac_meta_proc)0x0) break;
      goto LAB_00156bd6;
    }
    if (onMeta == (ma_dr_flac_meta_proc)0x0) break;
    if (local_1308 == (_func_void_ptr_size_t_void_ptr *)0x0) {
      if (local_1328 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto joined_r0x00156dab;
      __src = (ulong *)(*local_1328)((void *)0x0,uVar19,pvVar28);
    }
    else {
      __src = (ulong *)(*local_1308)(uVar19,pvVar28);
    }
    if (__src != (ulong *)0x0) {
      sVar9 = (*onRead)(pUserData,__src,uVar19);
      if (sVar9 == uVar19) {
        local_12d8.rawDataSize = (ma_uint32)local_1310;
        goto LAB_001569bb;
      }
      goto LAB_00156f22;
    }
    goto joined_r0x00156dab;
  }
  uVar24 = (uint)local_1310;
  uVar19 = local_1310;
  if (uVar24 == 0 || onMeta != (ma_dr_flac_meta_proc)0x0) {
LAB_00156bef:
    mVar25 = uVar26 + (uVar19 & 0xffffffff);
    if ((int)uVar18 < 0) goto LAB_00156f5c;
    sVar9 = (*onRead)(pUserData,&local_131c,4);
    if (sVar9 != 4) goto joined_r0x00156dab;
    goto LAB_00156445;
  }
LAB_00156bd6:
  mVar6 = (*local_1318)(pUserData,uVar24,ma_dr_flac_seek_origin_current);
  uVar19 = local_1310;
  if (mVar6 != 0) goto LAB_00156bef;
LAB_00156f55:
  mVar25 = uVar26 + (local_1310 & 0xffffffff);
LAB_00156f5c:
  local_1318 = (ma_dr_flac_seek_proc)((ulong)local_1300 / 0x12);
  sVar9 = (size_t)((int)local_1228 + (local_1300 / 0x12) * 0x18);
  uVar19 = local_12f0;
LAB_00156c2c:
  if (local_1308 == (_func_void_ptr_size_t_void_ptr *)0x0) {
    if (local_1328 != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
      pmVar10 = (ma_dr_flac *)(*local_1328)((void *)0x0,sVar9,pvVar28);
      goto LAB_00156c57;
    }
  }
  else {
    pmVar10 = (ma_dr_flac *)(*local_1308)(sVar9,pvVar28);
LAB_00156c57:
    if (pmVar10 != (ma_dr_flac *)0x0) {
      memset(pmVar10,0,0x1188);
      memcpy(&pmVar10->bs,&local_1220.bs,0x1050);
      pmVar4 = local_12e8;
      pmVar10->onMeta = local_1220.onMeta;
      pmVar10->pUserDataMD = local_1220.pUserDataMD;
      pmVar10->maxBlockSizeInPCMFrames = local_1220.maxBlockSizeInPCMFrames;
      pmVar10->sampleRate = local_1220.sampleRate;
      pmVar10->channels = local_1220.channels;
      pmVar10->bitsPerSample = local_1220.bitsPerSample;
      pmVar10->totalPCMFrameCount = local_1220.totalPCMFrameCount;
      pmVar10->container = local_1220.container;
      (pmVar10->allocationCallbacks).pUserData = pvVar28;
      (pmVar10->allocationCallbacks).onMalloc = local_1308;
      (pmVar10->allocationCallbacks).onRealloc = local_1328;
      (pmVar10->allocationCallbacks).onFree = local_1338;
      pmVar14 = (ma_int32 *)
                ((ulong)((long)&pmVar10[1].maxBlockSizeInPCMFrames + 1U) & 0xffffffffffffffc0);
      pmVar10->pDecodedSamples = pmVar14;
      if (local_1220.container == ma_dr_flac_container_ogg) {
        __dest = (void *)((long)pmVar14 +
                         ((ulong)local_1318 & 0xffffffff) * 0x18 + (local_12e0 & 0xffffffff));
        memcpy(__dest,local_12e8,0x10198);
        (*local_1338)(pmVar4,pvVar28);
        (pmVar10->bs).onRead = ma_dr_flac__on_read_ogg;
        (pmVar10->bs).onSeek = ma_dr_flac__on_seek_ogg;
        (pmVar10->bs).pUserData = __dest;
        pmVar10->_oggbs = __dest;
        pmVar10->firstFLACFramePosInBytes = mVar25;
        if (local_1220.container != ma_dr_flac_container_ogg) goto LAB_00156dc0;
        pmVar10->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
LAB_00156e7f:
        pmVar10->seekpointCount = 0;
      }
      else {
        pmVar10->firstFLACFramePosInBytes = mVar25;
LAB_00156dc0:
        if (uVar19 != 0) {
          mVar27 = (ma_uint32)local_1318;
          pmVar10->seekpointCount = mVar27;
          pmVar10->pSeekpoints =
               (ma_dr_flac_seekpoint *)((local_12e0 & 0xffffffff) + (long)pmVar10->pDecodedSamples);
          mVar6 = (*(pmVar10->bs).onSeek)
                            ((pmVar10->bs).pUserData,(int)uVar19,ma_dr_flac_seek_origin_start);
          if (mVar6 == 0) {
            pmVar10->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
            goto LAB_00156e7f;
          }
          if (mVar27 != 0) {
            pmVar21 = pmVar10->pSeekpoints;
            lVar23 = 0;
            do {
              sVar9 = (*(pmVar10->bs).onRead)
                                ((pmVar10->bs).pUserData,
                                 (void *)((long)&pmVar21->firstPCMFrame + lVar23),0x12);
              if (sVar9 != 0x12) {
                pmVar10->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
                pmVar10->seekpointCount = 0;
                break;
              }
              pmVar21 = pmVar10->pSeekpoints;
              uVar19 = *(ulong *)((long)&pmVar21->firstPCMFrame + lVar23);
              uVar26 = *(ulong *)((long)&pmVar21->flacFrameOffset + lVar23);
              *(ulong *)((long)&pmVar21->firstPCMFrame + lVar23) =
                   uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                   (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                   (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                   (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
              *(ulong *)((long)&pmVar21->flacFrameOffset + lVar23) =
                   uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                   (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                   (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                   (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38;
              puVar2 = (ushort *)((long)&pmVar21->pcmFrameCount + lVar23);
              *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
              lVar23 = lVar23 + 0x18;
            } while ((ulong)(mVar27 << 3) * 3 != lVar23);
          }
          mVar6 = (*(pmVar10->bs).onSeek)
                            ((pmVar10->bs).pUserData,(int)pmVar10->firstFLACFramePosInBytes,
                             ma_dr_flac_seek_origin_start);
          if (mVar6 == 0) goto LAB_00156f3a;
        }
      }
      if (local_1220.hasStreamInfoBlock != 0) {
        return pmVar10;
      }
      (pmVar10->currentFLACFrame).header.blockSizeInPCMFrames =
           local_1220.firstFrameHeader.blockSizeInPCMFrames;
      (pmVar10->currentFLACFrame).header.channelAssignment =
           local_1220.firstFrameHeader.channelAssignment;
      (pmVar10->currentFLACFrame).header.bitsPerSample = local_1220.firstFrameHeader.bitsPerSample;
      (pmVar10->currentFLACFrame).header.crc8 = local_1220.firstFrameHeader.crc8;
      *(undefined3 *)&(pmVar10->currentFLACFrame).header.field_0x15 =
           local_1220.firstFrameHeader._21_3_;
      (pmVar10->currentFLACFrame).header.pcmFrameNumber = local_1220.firstFrameHeader.pcmFrameNumber
      ;
      (pmVar10->currentFLACFrame).header.flacFrameNumber =
           local_1220.firstFrameHeader.flacFrameNumber;
      (pmVar10->currentFLACFrame).header.sampleRate = local_1220.firstFrameHeader.sampleRate;
      do {
        mVar8 = ma_dr_flac__decode_flac_frame(pmVar10);
        if (mVar8 != MA_CRC_MISMATCH) {
          if (mVar8 == MA_SUCCESS) {
            return pmVar10;
          }
          break;
        }
        mVar6 = ma_dr_flac__read_next_flac_frame_header
                          (&pmVar10->bs,pmVar10->bitsPerSample,&(pmVar10->currentFLACFrame).header);
      } while (mVar6 != 0);
      (*local_1338)(pmVar10,pvVar28);
      return (ma_dr_flac *)0x0;
    }
  }
joined_r0x00156dab:
  pmVar10 = local_12e8;
  local_12e8 = pmVar10;
  if (pmVar10 == (ma_dr_flac *)0x0) {
    return (ma_dr_flac *)0x0;
  }
LAB_00156f3a:
  (*local_1338)(pmVar10,pvVar28);
  return (ma_dr_flac *)0x0;
}

Assistant:

static ma_dr_flac* ma_dr_flac_open_with_metadata_private(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, ma_dr_flac_meta_proc onMeta, ma_dr_flac_container container, void* pUserData, void* pUserDataMD, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac_init_info init;
    ma_uint32 allocationSize;
    ma_uint32 wholeSIMDVectorCountPerChannel;
    ma_uint32 decodedSamplesAllocationSize;
#ifndef MA_DR_FLAC_NO_OGG
    ma_dr_flac_oggbs* pOggbs = NULL;
#endif
    ma_uint64 firstFramePos;
    ma_uint64 seektablePos;
    ma_uint32 seekpointCount;
    ma_allocation_callbacks allocationCallbacks;
    ma_dr_flac* pFlac;
    ma_dr_flac__init_cpu_caps();
    if (!ma_dr_flac__init_private(&init, onRead, onSeek, onMeta, container, pUserData, pUserDataMD)) {
        return NULL;
    }
    if (pAllocationCallbacks != NULL) {
        allocationCallbacks = *pAllocationCallbacks;
        if (allocationCallbacks.onFree == NULL || (allocationCallbacks.onMalloc == NULL && allocationCallbacks.onRealloc == NULL)) {
            return NULL;
        }
    } else {
        allocationCallbacks.pUserData = NULL;
        allocationCallbacks.onMalloc  = ma_dr_flac__malloc_default;
        allocationCallbacks.onRealloc = ma_dr_flac__realloc_default;
        allocationCallbacks.onFree    = ma_dr_flac__free_default;
    }
    allocationSize = sizeof(ma_dr_flac);
    if ((init.maxBlockSizeInPCMFrames % (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32))) == 0) {
        wholeSIMDVectorCountPerChannel = (init.maxBlockSizeInPCMFrames / (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32)));
    } else {
        wholeSIMDVectorCountPerChannel = (init.maxBlockSizeInPCMFrames / (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32))) + 1;
    }
    decodedSamplesAllocationSize = wholeSIMDVectorCountPerChannel * MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE * init.channels;
    allocationSize += decodedSamplesAllocationSize;
    allocationSize += MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE;
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg) {
        allocationSize += sizeof(ma_dr_flac_oggbs);
        pOggbs = (ma_dr_flac_oggbs*)ma_dr_flac__malloc_from_callbacks(sizeof(*pOggbs), &allocationCallbacks);
        if (pOggbs == NULL) {
            return NULL;
        }
        MA_DR_FLAC_ZERO_MEMORY(pOggbs, sizeof(*pOggbs));
        pOggbs->onRead = onRead;
        pOggbs->onSeek = onSeek;
        pOggbs->pUserData = pUserData;
        pOggbs->currentBytePos = init.oggFirstBytePos;
        pOggbs->firstBytePos = init.oggFirstBytePos;
        pOggbs->serialNumber = init.oggSerial;
        pOggbs->bosPageHeader = init.oggBosHeader;
        pOggbs->bytesRemainingInPage = 0;
    }
#endif
    firstFramePos  = 42;
    seektablePos   = 0;
    seekpointCount = 0;
    if (init.hasMetadataBlocks) {
        ma_dr_flac_read_proc onReadOverride = onRead;
        ma_dr_flac_seek_proc onSeekOverride = onSeek;
        void* pUserDataOverride = pUserData;
#ifndef MA_DR_FLAC_NO_OGG
        if (init.container == ma_dr_flac_container_ogg) {
            onReadOverride = ma_dr_flac__on_read_ogg;
            onSeekOverride = ma_dr_flac__on_seek_ogg;
            pUserDataOverride = (void*)pOggbs;
        }
#endif
        if (!ma_dr_flac__read_and_decode_metadata(onReadOverride, onSeekOverride, onMeta, pUserDataOverride, pUserDataMD, &firstFramePos, &seektablePos, &seekpointCount, &allocationCallbacks)) {
        #ifndef MA_DR_FLAC_NO_OGG
            ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
        #endif
            return NULL;
        }
        allocationSize += seekpointCount * sizeof(ma_dr_flac_seekpoint);
    }
    pFlac = (ma_dr_flac*)ma_dr_flac__malloc_from_callbacks(allocationSize, &allocationCallbacks);
    if (pFlac == NULL) {
    #ifndef MA_DR_FLAC_NO_OGG
        ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
    #endif
        return NULL;
    }
    ma_dr_flac__init_from_info(pFlac, &init);
    pFlac->allocationCallbacks = allocationCallbacks;
    pFlac->pDecodedSamples = (ma_int32*)ma_dr_flac_align((size_t)pFlac->pExtraData, MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE);
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg) {
        ma_dr_flac_oggbs* pInternalOggbs = (ma_dr_flac_oggbs*)((ma_uint8*)pFlac->pDecodedSamples + decodedSamplesAllocationSize + (seekpointCount * sizeof(ma_dr_flac_seekpoint)));
        MA_DR_FLAC_COPY_MEMORY(pInternalOggbs, pOggbs, sizeof(*pOggbs));
        ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
        pOggbs = NULL;
        pFlac->bs.onRead = ma_dr_flac__on_read_ogg;
        pFlac->bs.onSeek = ma_dr_flac__on_seek_ogg;
        pFlac->bs.pUserData = (void*)pInternalOggbs;
        pFlac->_oggbs = (void*)pInternalOggbs;
    }
#endif
    pFlac->firstFLACFramePosInBytes = firstFramePos;
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg)
    {
        pFlac->pSeekpoints = NULL;
        pFlac->seekpointCount = 0;
    }
    else
#endif
    {
        if (seektablePos != 0) {
            pFlac->seekpointCount = seekpointCount;
            pFlac->pSeekpoints = (ma_dr_flac_seekpoint*)((ma_uint8*)pFlac->pDecodedSamples + decodedSamplesAllocationSize);
            MA_DR_FLAC_ASSERT(pFlac->bs.onSeek != NULL);
            MA_DR_FLAC_ASSERT(pFlac->bs.onRead != NULL);
            if (pFlac->bs.onSeek(pFlac->bs.pUserData, (int)seektablePos, ma_dr_flac_seek_origin_start)) {
                ma_uint32 iSeekpoint;
                for (iSeekpoint = 0; iSeekpoint < seekpointCount; iSeekpoint += 1) {
                    if (pFlac->bs.onRead(pFlac->bs.pUserData, pFlac->pSeekpoints + iSeekpoint, MA_DR_FLAC_SEEKPOINT_SIZE_IN_BYTES) == MA_DR_FLAC_SEEKPOINT_SIZE_IN_BYTES) {
                        pFlac->pSeekpoints[iSeekpoint].firstPCMFrame   = ma_dr_flac__be2host_64(pFlac->pSeekpoints[iSeekpoint].firstPCMFrame);
                        pFlac->pSeekpoints[iSeekpoint].flacFrameOffset = ma_dr_flac__be2host_64(pFlac->pSeekpoints[iSeekpoint].flacFrameOffset);
                        pFlac->pSeekpoints[iSeekpoint].pcmFrameCount   = ma_dr_flac__be2host_16(pFlac->pSeekpoints[iSeekpoint].pcmFrameCount);
                    } else {
                        pFlac->pSeekpoints = NULL;
                        pFlac->seekpointCount = 0;
                        break;
                    }
                }
                if (!pFlac->bs.onSeek(pFlac->bs.pUserData, (int)pFlac->firstFLACFramePosInBytes, ma_dr_flac_seek_origin_start)) {
                    ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                    return NULL;
                }
            } else {
                pFlac->pSeekpoints = NULL;
                pFlac->seekpointCount = 0;
            }
        }
    }
    if (!init.hasStreamInfoBlock) {
        pFlac->currentFLACFrame.header = init.firstFrameHeader;
        for (;;) {
            ma_result result = ma_dr_flac__decode_flac_frame(pFlac);
            if (result == MA_SUCCESS) {
                break;
            } else {
                if (result == MA_CRC_MISMATCH) {
                    if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                        ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                        return NULL;
                    }
                    continue;
                } else {
                    ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                    return NULL;
                }
            }
        }
    }
    return pFlac;
}